

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O0

Doctor * __thiscall
Hospital::Find_Doctor_From_His_Id
          (Hospital *this,vector<Doctor,_std::allocator<Doctor>_> *All_Of_Doctors,string *id)

{
  code *pcVar1;
  __type _Var2;
  size_type sVar3;
  reference pvVar4;
  reference __lhs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  int local_24;
  string *psStack_20;
  int A;
  string *id_local;
  vector<Doctor,_std::allocator<Doctor>_> *All_Of_Doctors_local;
  Hospital *this_local;
  
  local_24 = 0;
  psStack_20 = id;
  id_local = (string *)All_Of_Doctors;
  All_Of_Doctors_local = (vector<Doctor,_std::allocator<Doctor>_> *)this;
  sVar3 = std::vector<Doctor,_std::allocator<Doctor>_>::size(All_Of_Doctors);
  if (sVar3 != 0) {
    pvVar4 = std::vector<Doctor,_std::allocator<Doctor>_>::operator[]
                       ((vector<Doctor,_std::allocator<Doctor>_> *)id_local,(long)local_24);
    Doctor::doctor_all_ino_getter_abi_cxx11_(&local_40,pvVar4);
    __lhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&local_40,0);
    _Var2 = std::operator==(__lhs,id);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_40);
    if (_Var2) {
      pvVar4 = std::vector<Doctor,_std::allocator<Doctor>_>::operator[]
                         ((vector<Doctor,_std::allocator<Doctor>_> *)id_local,(long)local_24);
      return pvVar4;
    }
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

Doctor* Hospital:: Find_Doctor_From_His_Id (vector<Doctor>& All_Of_Doctors,string id){
    for (int A = 0; A < All_Of_Doctors.size() ; ++A) {
        if (All_Of_Doctors[A].doctor_all_ino_getter()[0]==id)
            return  &All_Of_Doctors [A];
        break;
    }
}